

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O3

bool __thiscall Liby::http::ReplyParser::ParseStatus(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  iterator iVar4;
  undefined8 uVar5;
  int status;
  int local_5c;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58);
  __nptr = local_58[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    local_5c = (int)lVar3;
    iVar4 = std::
            _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&status_number_abi_cxx11_._M_h,&local_5c);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      this->progress_ = 3;
      (this->super_Reply).status_ = local_5c;
    }
    return iVar4.
           super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           ._M_cur != (__node_type *)0x0;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

bool ReplyParser::ParseStatus(const char *begin, const char *end) {
    int status = std::stoi(std::string(begin, end));
    auto it = status_number.find(status);
    if (it == status_number.end()) {
        return false;
    } else {
        progress_ = ParsingStatusString;
        status_ = status;
        return true;
    }
}